

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XMLReader::skipSpaces(XMLReader *this,bool *skippedSomething,bool inDecl)

{
  XMLCh XVar1;
  ulong uVar2;
  bool bVar3;
  undefined8 in_RAX;
  ulong uVar4;
  XMLCh curCh;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
LAB_002bc943:
  do {
    uVar4 = this->fCharIndex;
    uVar2 = this->fCharsAvail;
    while (uVar4 < uVar2) {
      XVar1 = this->fCharBuf[uVar4];
      if (-1 < (char)this->fgCharCharsTable[(ushort)XVar1]) {
        return true;
      }
      uVar4 = uVar4 + 1;
      this->fCharIndex = uVar4;
      uStack_28 = CONCAT26(XVar1,(undefined6)uStack_28);
      *skippedSomething = true;
      if ((XVar1 & 6U) != 0) {
        handleEOL(this,(XMLCh *)((long)&uStack_28 + 6),inDecl);
        goto LAB_002bc943;
      }
      this->fCurCol = this->fCurCol + 1;
    }
    bVar3 = refreshCharBuffer(this);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool XMLReader::skipSpaces(bool& skippedSomething, bool inDecl)
{
    //  DO NOT set the skippedSomething to 'false', but change it to be 'true' only

    //  We enter a loop where we skip over spaces until we hit the end of
    //  this reader or a non-space value. The return indicates whether we
    //  hit the non-space (true) or the end (false).
    do
    {
        // Loop through the current chars in the buffer
        while (fCharIndex < fCharsAvail)
        {
            //  See if its a white space char. If so, then process it. Else
            //  we've hit a non-space and need to return.
            if (isWhitespace(fCharBuf[fCharIndex]))
            {
                // Get the current char out of the buffer and eat it
                XMLCh curCh = fCharBuf[fCharIndex++];
                skippedSomething = true;
                //
                //  'curCh' is a whitespace(x20|x9|xD|xA), so we only can have
                //  end-of-line combinations with a leading chCR(xD) or chLF(xA)
                //
                //  100000 x20
                //  001001 x9
                //  001010 chLF
                //  001101 chCR
                //  -----------
                //  000110 == (chCR|chLF) & ~(0x9|0x20)
                //
                //  if the result of the logical-& operation is
                //  true  : 'curCh' must be xA  or xD
                //  false : 'curCh' must be x20 or x9
                //
                if ( ( curCh & (chCR|chLF) & ~(0x9|0x20) ) == 0 )
                {
                    fCurCol++;
                } else
                {
                    handleEOL(curCh, inDecl);
                }
            }
            else
                return true;
        }

        //  We've eaten up the current buffer, so lets try to reload it. If
        //  we don't get anything new, then break out. If we do, then we go
        //  back to the top to keep getting spaces.
    } while(refreshCharBuffer());

    // We never hit any non-space and ate up the whole reader
    return false;
}